

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

int Bac_NtkDfsUserBoxes(Bac_Ntk_t *p)

{
  int iVar1;
  int local_1c;
  int iObj;
  Bac_Ntk_t *p_local;
  
  Bac_NtkStartCopies(p);
  Vec_IntClear(&p->vArray);
  local_1c = 0;
  while( true ) {
    iVar1 = Bac_NtkObjNum(p);
    if (iVar1 <= local_1c) {
      return 1;
    }
    iVar1 = Bac_ObjIsBoxUser(p,local_1c);
    if ((iVar1 != 0) && (iVar1 = Bac_NtkDfsUserBoxes_rec(p,local_1c,&p->vArray), iVar1 == 0)) break;
    local_1c = local_1c + 1;
  }
  printf("Cyclic dependency of user boxes is detected.\n");
  return 0;
}

Assistant:

int Bac_NtkDfsUserBoxes( Bac_Ntk_t * p )
{
    int iObj;
    Bac_NtkStartCopies( p ); // -1 = not visited; 0 = on the path; 1 = finished
    Vec_IntClear( &p->vArray );
    Bac_NtkForEachBoxUser( p, iObj )
        if ( !Bac_NtkDfsUserBoxes_rec( p, iObj, &p->vArray ) )
        {
            printf( "Cyclic dependency of user boxes is detected.\n" );
            return 0;
        }
    return 1;
}